

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

Section * scommon_section(GlobalVars *gv,ObjectUnit *ou)

{
  long in_RSI;
  unsigned_long in_RDI;
  uint8_t *unaff_retaddr;
  char *in_stack_00000008;
  ObjectUnit *in_stack_00000010;
  Section *s;
  Section *local_18;
  
  local_18 = *(Section **)(in_RSI + 0x40);
  if (local_18 == (Section *)0x0) {
    local_18 = add_section(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,
                           (uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),
                           (uint8_t)s,(uint8_t)ou,(bool)gv);
    if (*(long *)(in_RSI + 0x38) != 0) {
      local_18->alignment = *(uint8_t *)(*(long *)(in_RSI + 0x38) + 0x2f);
    }
    *(Section **)(in_RSI + 0x40) = local_18;
  }
  return local_18;
}

Assistant:

struct Section *scommon_section(struct GlobalVars *gv,struct ObjectUnit *ou)
/* returns the dummy section for small-data COMMON symbols, or creates it */
{
  struct Section *s;

  if (!(s = ou->scommon)) {
    s = add_section(ou,gv->scommon_sec_name,NULL,0,ST_UDATA,
                    SF_ALLOC|SF_UNINITIALIZED,SP_READ|SP_WRITE,0,TRUE);
    if (ou->common)
      s->alignment = ou->common->alignment;  /* inherit .common alignment */
    ou->scommon = s;
  }
  return s;
}